

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall WebSocketsession::do_read(WebSocketsession *this)

{
  run_read_op local_49;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
  local_30;
  
  std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<WebSocketsession,void>
            ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_30.h_ = (offset_in_WebSocketsession_to_subr)on_read;
  local_30._8_8_ = 0;
  local_30.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  local_30.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
  super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_40;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::websocket::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,true>
  ::run_read_op::operator()(&local_49,&local_30,&(this->ws).impl_,&this->buffer,0,false);
  if (local_30.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
      super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<WebSocketsession>_>
               .super_tuple_element_impl<0UL,_std::shared_ptr<WebSocketsession>_>.t.
               super___shared_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return;
}

Assistant:

void do_read()
    {
        // Read a message into our buffer
        ws.async_read(buffer,
                      beast::bind_front_handler(&WebSocketsession::on_read, shared_from_this()));
    }